

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void v_predictor_32xh(uint8_t *dst,ptrdiff_t stride,uint8_t *above,int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int local_8c;
  int i;
  __m128i row1;
  __m128i row0;
  uint8_t *puStack_50;
  int height_local;
  uint8_t *above_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 8);
  uVar3 = *(undefined8 *)(above + 0x10);
  uVar4 = *(undefined8 *)(above + 0x18);
  puStack_50 = dst;
  for (local_8c = 0; local_8c < height; local_8c = local_8c + 1) {
    *(undefined8 *)puStack_50 = uVar1;
    *(undefined8 *)(puStack_50 + 8) = uVar2;
    *(undefined8 *)(puStack_50 + 0x10) = uVar3;
    *(undefined8 *)(puStack_50 + 0x18) = uVar4;
    puStack_50 = puStack_50 + stride;
  }
  return;
}

Assistant:

static inline void v_predictor_32xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, int height) {
  const __m128i row0 = _mm_load_si128((__m128i const *)above);
  const __m128i row1 = _mm_load_si128((__m128i const *)(above + 16));
  for (int i = 0; i < height; ++i) {
    _mm_store_si128((__m128i *)dst, row0);
    _mm_store_si128((__m128i *)(dst + 16), row1);
    dst += stride;
  }
}